

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

TV __thiscall Nova::Grid<float,_3>::Face(Grid<float,_3> *this,int axis,T_INDEX *index)

{
  int i;
  long lVar1;
  long in_RCX;
  undefined4 in_register_00000034;
  long lVar2;
  TV TVar3;
  Vector<float,_3,_true> data_copy;
  undefined8 local_1c;
  undefined4 local_14;
  undefined8 local_10;
  undefined4 local_8;
  
  lVar2 = CONCAT44(in_register_00000034,axis);
  lVar1 = 0;
  do {
    *(float *)((long)&local_1c + lVar1 * 4) = (float)*(int *)(in_RCX + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    TVar3._data._M_elems[2] = *(float *)((long)&local_1c + lVar1) + -0.5;
    *(float *)((long)&local_1c + lVar1) = TVar3._data._M_elems[2];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  lVar1 = (long)(int)(uint)index;
  if ((uint)index < 3) {
    *(float *)((long)&local_1c + lVar1 * 4) = *(float *)((long)&local_1c + lVar1 * 4) + -0.5;
    local_8 = local_14;
    local_10 = local_1c;
    lVar1 = 0;
    do {
      *(float *)((long)&local_10 + lVar1) =
           *(float *)((long)&local_10 + lVar1) * *(float *)(lVar2 + 0x24 + lVar1);
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0xc);
    (this->counts)._data._M_elems[2] = *(int *)(lVar2 + 0x14);
    *(undefined8 *)(this->counts)._data._M_elems = *(undefined8 *)(lVar2 + 0xc);
    lVar1 = 0;
    do {
      TVar3._data._M_elems[0] =
           *(float *)((long)(this->counts)._data._M_elems + lVar1) +
           *(float *)((long)&local_10 + lVar1);
      TVar3._data._M_elems[1] = 0.0;
      *(float *)((long)(this->counts)._data._M_elems + lVar1) = TVar3._data._M_elems[0];
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0xc);
    return (TV)TVar3._data._M_elems;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar1,3);
}

Assistant:

TV Face(const int axis,const T_INDEX& index) const
    {
        TV shifted_index(TV(index)-(T).5);
        shifted_index(axis)-=(T).5;
        return domain.min_corner+shifted_index*dX;
    }